

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

Charmap * charmap_New(char *name,char *baseName)

{
  size_t sVar1;
  Charmap *pCVar2;
  Charmap *element;
  char *key;
  Charmap *charmap;
  
  if (baseName == (char *)0x0) {
    pCVar2 = (Charmap *)0x0;
  }
  else {
    pCVar2 = charmap_Get(baseName);
    if (pCVar2 == (Charmap *)0x0) {
      pCVar2 = (Charmap *)0x0;
      error("Base charmap \'%s\' doesn\'t exist\n",baseName);
    }
  }
  element = charmap_Get(name);
  charmap = element;
  if (element == (Charmap *)0x0) {
    if (pCVar2 == (Charmap *)0x0) {
      resizeCharmap(&charmap,0x20);
      element = charmap;
      charmap->usedNodes = 1;
      *(undefined1 *)&charmap[1].name = 0;
      memset(&charmap[1].usedNodes,0,0x7f8);
    }
    else {
      resizeCharmap(&charmap,pCVar2->capacity);
      element = charmap;
      sVar1 = pCVar2->usedNodes;
      charmap->usedNodes = sVar1;
      memcpy(charmap + 1,pCVar2 + 1,sVar1 << 0xb);
    }
    key = strdup(name);
    element->name = key;
    currentCharmap = (Charmap **)hash_AddElement(charmaps,key,element);
  }
  else {
    error("Charmap \'%s\' already exists\n",name);
  }
  return element;
}

Assistant:

struct Charmap *charmap_New(char const *name, char const *baseName)
{
	struct Charmap *base = NULL;

	if (baseName != NULL) {
		base = charmap_Get(baseName);

		if (base == NULL)
			error("Base charmap '%s' doesn't exist\n", baseName);
	}

	struct Charmap *charmap = charmap_Get(name);

	if (charmap) {
		error("Charmap '%s' already exists\n", name);
		return charmap;
	}

	// Init the new charmap's fields
	if (base) {
		resizeCharmap(&charmap, base->capacity);
		charmap->usedNodes = base->usedNodes;

		memcpy(charmap->nodes, base->nodes, sizeof(base->nodes[0]) * charmap->usedNodes);
	} else {
		resizeCharmap(&charmap, INITIAL_CAPACITY);
		charmap->usedNodes = 1;
		initNode(&charmap->nodes[0]); // Init the root node
	}
	charmap->name = strdup(name);

	currentCharmap = (struct Charmap **)hash_AddElement(charmaps, charmap->name, charmap);

	return charmap;
}